

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_3::RgbaYca::fixSaturation(V3f *yw,int n,Rgba **rgbaIn,Rgba *rgbaOut)

{
  long lVar1;
  float *pfVar2;
  long in_RCX;
  long lVar3;
  long in_RDX;
  int in_ESI;
  Rgba *in_RDI;
  V3f *unaff_retaddr;
  float sMax;
  float s;
  Rgba *out;
  Rgba *in;
  float sMean;
  float neighborB0;
  float neighborA0;
  int i;
  float neighborB1;
  float neighborB2;
  float neighborA1;
  float neighborA2;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  Rgba *in_stack_ffffffffffffffa8;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  long local_20;
  long local_18;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_28 = anon_unknown_9::saturation(in_stack_ffffffffffffffa8);
  local_24 = local_28;
  local_30 = anon_unknown_9::saturation(in_stack_ffffffffffffffa8);
  local_34 = 0;
  local_2c = local_30;
  do {
    if (local_c <= local_34) {
      return;
    }
    local_38 = local_28;
    local_28 = local_24;
    local_3c = local_30;
    local_30 = local_2c;
    if (local_34 < local_c + -1) {
      local_24 = anon_unknown_9::saturation(in_stack_ffffffffffffffa8);
      local_2c = anon_unknown_9::saturation(in_stack_ffffffffffffffa8);
    }
    local_44 = 1.0;
    local_48 = (local_38 + local_24 + local_3c + local_2c) * 0.25;
    pfVar2 = std::min<float>(&local_44,&local_48);
    local_40 = *pfVar2;
    lVar1 = *(long *)(local_18 + 8);
    lVar3 = (long)local_34;
    in_stack_ffffffffffffffa8 = (Rgba *)(local_20 + (long)local_34 * 8);
    local_5c = anon_unknown_9::saturation(in_stack_ffffffffffffffa8);
    if (local_5c <= local_40) {
LAB_0013ce92:
      *in_stack_ffffffffffffffa8 = *(Rgba *)(lVar1 + lVar3 * 8);
    }
    else {
      local_64 = 1.0;
      local_68 = -(1.0 - local_40) * 0.25 + 1.0;
      pfVar2 = std::min<float>(&local_64,&local_68);
      local_60 = *pfVar2;
      if (local_5c <= local_60) goto LAB_0013ce92;
      anon_unknown_9::desaturate(out,s,unaff_retaddr,in_RDI);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void
fixSaturation (
    const IMATH_NAMESPACE::V3f& yw,
    int                         n,
    const Rgba* const           rgbaIn[3],
    Rgba                        rgbaOut[/*n*/])
{
    float neighborA2 = saturation (rgbaIn[0][0]);
    float neighborA1 = neighborA2;

    float neighborB2 = saturation (rgbaIn[2][0]);
    float neighborB1 = neighborB2;

    for (int i = 0; i < n; ++i)
    {
        float neighborA0 = neighborA1;
        neighborA1       = neighborA2;

        float neighborB0 = neighborB1;
        neighborB1       = neighborB2;

        if (i < n - 1)
        {
            neighborA2 = saturation (rgbaIn[0][i + 1]);
            neighborB2 = saturation (rgbaIn[2][i + 1]);
        }

        //
        // A0       A1       A2
        //      rgbaOut[i]
        // B0       B1       B2
        //

        float sMean = min (
            1.0f, 0.25f * (neighborA0 + neighborA2 + neighborB0 + neighborB2));

        const Rgba& in  = rgbaIn[1][i];
        Rgba&       out = rgbaOut[i];

        float s = saturation (in);

        if (s > sMean)
        {
            float sMax = min (1.0f, 1 - (1 - sMean) * 0.25f);

            if (s > sMax)
            {
                desaturate (in, sMax / s, yw, out);
                continue;
            }
        }

        out = in;
    }
}